

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::
Marray<float,false,std::allocator<unsigned_long>>
          (Marray<float,std::allocator<unsigned_long>> *this,
          View<float,_false,_std::allocator<unsigned_long>_> *in)

{
  size_t sVar1;
  pointer pfVar2;
  size_t *psVar3;
  long lVar4;
  size_type __n;
  unsigned_long *puVar5;
  runtime_error *prVar6;
  float *pfVar7;
  ulong uVar8;
  const_iterator it;
  Iterator<float,_true,_std::allocator<unsigned_long>_> local_48;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x38) = 1;
  this[0x3c] = (Marray<float,std::allocator<unsigned_long>>)0x1;
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
  if (in != (View<float,_false,_std::allocator<unsigned_long>_> *)this) {
    if ((in->geometry_).dimension_ != *(size_t *)(this + 0x28)) {
      operator_delete(*(void **)(this + 0x10),*(size_t *)(this + 0x28) * 0x18);
      sVar1 = (in->geometry_).dimension_;
      *(size_t *)(this + 0x28) = sVar1;
      puVar5 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)(this + 8),sVar1 * 3,(void *)0x0);
      *(unsigned_long **)(this + 0x10) = puVar5;
      *(unsigned_long **)(this + 0x18) = puVar5 + *(long *)(this + 0x28);
      *(unsigned_long **)(this + 0x20) = puVar5 + *(long *)(this + 0x28) + *(long *)(this + 0x28);
      *(size_t *)(this + 0x28) = (in->geometry_).dimension_;
    }
    memcpy(*(void **)(this + 0x10),(in->geometry_).shape_,*(long *)(this + 0x28) * 0x18);
    *(size_t *)(this + 0x30) = (in->geometry_).size_;
    *(CoordinateOrder *)(this + 0x38) = (in->geometry_).coordinateOrder_;
    this[0x3c] = (Marray<float,std::allocator<unsigned_long>>)(in->geometry_).isSimple_;
  }
  pfVar2 = in->data_;
  if (pfVar2 != (pointer)0x0) {
    psVar3 = (in->geometry_).shapeStrides_;
    lVar4 = *(long *)(this + 0x20);
    uVar8 = 0;
    do {
      if ((in->geometry_).dimension_ <= uVar8) {
        this[0x3c] = (Marray<float,std::allocator<unsigned_long>>)0x1;
        __n = (in->geometry_).size_;
        if (__n == 0) {
          pfVar7 = (float *)0x0;
        }
        else {
          pfVar7 = __gnu_cxx::new_allocator<float>::allocate
                             ((new_allocator<float> *)(this + 0x40),__n,(void *)0x0);
        }
        *(float **)this = pfVar7;
        View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
        if ((in->geometry_).isSimple_ == true) {
          memcpy(*(void **)this,in->data_,(in->geometry_).size_ << 2);
        }
        else {
          View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
          Iterator<float,_true,_std::allocator<unsigned_long>_>::Iterator(&local_48,in,0);
          for (uVar8 = 0; uVar8 < *(ulong *)(this + 0x30); uVar8 = uVar8 + 1) {
            if ((local_48.view_ == (view_pointer)0x0) ||
               (((local_48.view_)->geometry_).size_ <= local_48.index_)) {
              prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar6,"Assertion failed.");
              __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            *(float *)(*(long *)this + uVar8 * 4) = *local_48.pointer_;
            Iterator<float,_true,_std::allocator<unsigned_long>_>::operator++(&local_48);
          }
          if (local_48.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
        if (this[0x3c] != (Marray<float,std::allocator<unsigned_long>>)0x0) {
          return;
        }
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Assertion failed.");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((in->geometry_).dimension_ <= uVar8) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Assertion failed.");
        goto LAB_001eb12d;
      }
      if (*(ulong *)(this + 0x28) <= uVar8) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Assertion failed.");
        goto LAB_001eb12d;
      }
      *(size_t *)(lVar4 + uVar8 * 8) = psVar3[uVar8];
      uVar8 = uVar8 + 1;
    } while (pfVar2 != (pointer)0x0);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"Assertion failed.");
LAB_001eb12d:
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    const View<TLocal, isConstLocal, ALocal>& in
) 
: dataAllocator_()
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }

    // adapt geometry
    this->geometry_ = in.geometry_;
    for(std::size_t j=0; j<in.dimension(); ++j) {
        this->geometry_.strides(j) = in.geometry_.shapeStrides(j); // !
    }
    this->geometry_.isSimple() = true;

    // copy data
    if(in.size() == 0) {
        this->data_ = 0;
    }
    else {
        this->data_ = dataAllocator_.allocate(in.size());
    }
    if(in.isSimple() && marray_detail::IsEqual<T, TLocal>::type) {
        memcpy(this->data_, in.data_, (in.size())*sizeof(T));
    }
    else {
        typename View<TLocal, isConstLocal, ALocal>::const_iterator it = in.begin();
        for(std::size_t j=0; j<this->size(); ++j, ++it)  {
            this->data_[j] = static_cast<T>(*it);
        }
    }

    testInvariant();
}